

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::object_from_column_builder<relive::Url>::operator()
          (object_from_column_builder<relive::Url> *this,
          column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>
          *c)

{
  long lVar1;
  long *plVar2;
  long in_RSI;
  long in_RDI;
  long value;
  sqlite3_stmt *in_stack_ffffffffffffffb8;
  row_extractor<long,_void> *in_stack_ffffffffffffffc0;
  code *pcVar3;
  
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  lVar1 = row_extractor<long,_void>::extract(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
  if (*(long *)(in_RSI + 0x20) == -1) {
    pcVar3 = *(code **)(in_RSI + 0x38);
    plVar2 = (long *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RSI + 0x40));
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *plVar2 + -1);
    }
    (*pcVar3)(plVar2,lVar1);
  }
  else {
    *(long *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RSI + 0x20)) = lVar1;
  }
  return;
}

Assistant:

void operator()(const C &c) const {
        using field_type = typename C::field_type;
        auto value = row_extractor<field_type>().extract(this->stmt, this->index++);
        if(c.member_pointer) {
            this->object.*c.member_pointer = std::move(value);
        } else {
            ((this->object).*(c.setter))(std::move(value));
        }
    }